

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O3

bool __thiscall Wasm::PolymorphicEmitInfo::IsUnreachable(PolymorphicEmitInfo *this)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  
  uVar1 = this->count;
  if ((ulong)uVar1 == 0) {
    return false;
  }
  if (uVar1 != 1) {
    lVar2 = 0;
    do {
      bVar3 = (this->field_1).infos[lVar2].type == Any;
      if (bVar3) {
        return bVar3;
      }
      bVar4 = (ulong)uVar1 - 1 != lVar2;
      lVar2 = lVar2 + 1;
    } while (bVar4);
    return bVar3;
  }
  return (this->field_1).singleInfo.type == Any;
}

Assistant:

bool PolymorphicEmitInfo::IsUnreachable() const
{
    if (count == 0)
    {
        return false;
    }
    if (count == 1)
    {
        return singleInfo.type == WasmTypes::Any;
    }
    for (uint32 i = 0; i < count; ++i)
    {
        if (infos[i].type == WasmTypes::Any)
        {
            return true;
        }
    }
    return false;
}